

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray * sizedForOverwrite(QBitArray *a1,QBitArray *a2)

{
  DataPtr *pDVar1;
  DataPtr *pDVar2;
  longlong *n_00;
  DataPtr *pDVar3;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  QByteArrayData *d2;
  QByteArrayData *d1;
  QBitArray *result;
  QByteArrayData bytes;
  qsizetype n2;
  qsizetype n1;
  QArrayDataPointer<char> *in_stack_ffffffffffffff48;
  QArrayDataPointer<char> *this;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (((QByteArray *)&in_RDI->d)->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QBitArray::QBitArray((QBitArray *)0x5887e1);
  pDVar1 = QBitArray::data_ptr((QBitArray *)0x5887f8);
  pDVar2 = QBitArray::data_ptr((QBitArray *)0x588822);
  local_10 = pDVar1->size;
  local_18 = pDVar2->size;
  pDVar3 = pDVar2;
  n_00 = qMax<long_long>(&local_10,&local_18);
  QArrayDataPointer<char>::QArrayDataPointer
            (this,(qsizetype)pDVar3,(qsizetype)n_00,
             (AllocationOption)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (local_18 < local_10) {
    DAT_aaaaaaaaaaaaaaaa = *pDVar1->ptr;
    (&DAT_aaaaaaaaaaaaaaaa)[local_10] = 0;
  }
  else if (local_10 < local_18) {
    DAT_aaaaaaaaaaaaaaaa = *pDVar2->ptr;
    (&DAT_aaaaaaaaaaaaaaaa)[local_18] = 0;
  }
  else if (local_10 != 0) {
    in_stack_ffffffffffffff48 = (QArrayDataPointer<char> *)qMin<char>(pDVar1->ptr,pDVar2->ptr);
    DAT_aaaaaaaaaaaaaaaa = *(char *)&in_stack_ffffffffffffff48->d;
    (&DAT_aaaaaaaaaaaaaaaa)[local_10] = 0;
  }
  pDVar3 = QBitArray::data_ptr((QBitArray *)0x5889ce);
  QArrayDataPointer<char>::operator=(in_stack_ffffffffffffff48,pDVar3);
  QArrayDataPointer<char>::~QArrayDataPointer(pDVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QBitArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QBitArray sizedForOverwrite(const QBitArray &a1, const QBitArray &a2)
{
    QBitArray result;
    const QByteArrayData &d1 = a1.data_ptr();
    const QByteArrayData &d2 = a2.data_ptr();
    qsizetype n1 = d1.size;
    qsizetype n2 = d2.size;
    qsizetype n = qMax(n1, n2);

    QByteArrayData bytes(n, n);

    // initialize the count of bits in the last byte (see construction note)
    // and the QByteArray null termination (some of our algorithms read it)
    if (n1 > n2) {
        *bytes.ptr = *d1.ptr;
        bytes.ptr[n1] = 0;
    } else if (n2 > n1) {
        *bytes.ptr = *d2.ptr;
        bytes.ptr[n2] = 0;
    } else if (n1) {    // n1 == n2
        *bytes.ptr = qMin(*d1.ptr, *d2.ptr);
        bytes.ptr[n1] = 0;
    }

    result.data_ptr() = std::move(bytes);
    return result;
}